

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall sf::String::substring(String *this,size_t position,size_t length)

{
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *this_00
  ;
  size_type in_stack_ffffffffffffffb0;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffb8;
  undefined1 local_40 [64];
  
  this_00 = in_RDI;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::substr
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(size_type)local_40);
  String((String *)this_00,in_RDI);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(this_00);
  return (String *)in_RDI;
}

Assistant:

String String::substring(std::size_t position, std::size_t length) const
{
    return m_string.substr(position, length);
}